

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void cvarfunc_fluid_voices(FIntCVar *self)

{
  if (self->Value < 0x10) {
    FIntCVar::operator=(self,0x10);
    return;
  }
  if (0x1000 < (uint)self->Value) {
    FIntCVar::operator=(self,0x1000);
    return;
  }
  if (currSong != (MusInfo *)0x0) {
    (*currSong->_vptr_MusInfo[0x11])(currSong,"synth.polyphony");
    return;
  }
  return;
}

Assistant:

inline operator int () const { return Value; }